

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

int __thiscall
QTextDocumentPrivate::remove_block
          (QTextDocumentPrivate *this,int pos,int *blockFormat,int command,Operation op)

{
  BlockMap *this_00;
  uint *puVar1;
  uint uVar2;
  quint32 qVar3;
  long lVar4;
  undefined8 *puVar5;
  uint uVar6;
  uint z;
  uint f;
  long *plVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  Header *pHVar11;
  QTextBlockData *pQVar12;
  ulong uVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->blocks;
  uVar6 = QFragmentMapData<QTextBlockData>::findNode(&this_00->data,pos,0);
  z = QFragmentMapData<QTextFragmentData>::findNode(&(this->fragments).data,pos,0);
  uVar13 = (ulong)uVar6;
  if ((command != 6) ||
     (pQVar12 = (this->blocks).data.field_0.fragments, uVar14 = uVar13, f = uVar6,
     pQVar12[uVar13].super_QFragment<3>.size_array[0] != 1)) {
    f = QFragmentMapData<QTextBlockData>::next(&this_00->data,uVar6);
    pQVar12 = (this_00->data).field_0.fragments;
    uVar2 = pQVar12[uVar13].super_QFragment<3>.parent;
    uVar14 = (ulong)f;
    qVar3 = pQVar12[uVar14].super_QFragment<3>.size_array[0];
    pQVar12[uVar13].super_QFragment<3>.size_array[0] =
         (pQVar12[uVar13].super_QFragment<3>.size_array[0] + qVar3) - 1;
    if (uVar2 != 0) {
      uVar10 = uVar6;
      do {
        uVar9 = uVar2;
        puVar1 = (uint *)((long)(this_00->data).field_0.head + (ulong)uVar9 * 0x48);
        if (puVar1[1] == uVar10) {
          puVar1[4] = puVar1[4] + (qVar3 - 1);
        }
        uVar2 = *puVar1;
        uVar10 = uVar9;
      } while (*puVar1 != 0);
    }
    pHVar11 = (this_00->data).field_0.head;
    if ((uVar6 != 0) &&
       (puVar5 = *(undefined8 **)((long)pHVar11 + uVar13 * 0x48 + 0x30), puVar5 != (undefined8 *)0x0
       )) {
      QTextEngine::invalidate((QTextEngine *)*puVar5);
      pHVar11 = (this_00->data).field_0.head;
    }
    *(undefined4 *)((long)pHVar11 + uVar13 * 0x48 + 0x40) =
         *(undefined4 *)((long)pHVar11 + uVar14 * 0x48 + 0x40);
    pQVar12 = (QTextBlockData *)(this_00->data).field_0.head;
  }
  *blockFormat = pQVar12[uVar14].format;
  objectForFormat(this,(this->blocks).data.field_0.fragments[uVar14].format);
  plVar7 = (long *)QMetaObject::cast((QObject *)&QTextBlockGroup::staticMetaObject);
  if (plVar7 != (long *)0x0) {
    (**(code **)(*plVar7 + 0x68))(plVar7);
  }
  objectForFormat(this,(this->fragments).data.field_0.fragments[z].format);
  lVar8 = QMetaObject::cast((QObject *)&QTextFrame::staticMetaObject);
  if (lVar8 != 0) {
    (**(code **)(**(long **)(lVar8 + 8) + 0x28))
              (*(long **)(lVar8 + 8),
               (this->text).d.ptr[(this->fragments).data.field_0.fragments[z].stringPosition],z);
    this->framesDirty = true;
  }
  QFragmentMap<QTextBlockData>::erase_single(this_00,f);
  uVar6 = QFragmentMapData<QTextFragmentData>::erase_single(&(this->fragments).data,z);
  adjustDocumentChangesAndCursors(this,pos,-1,op);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return uVar6;
  }
  __stack_chk_fail();
}

Assistant:

int QTextDocumentPrivate::remove_block(int pos, int *blockFormat, int command, QTextUndoCommand::Operation op)
{
    Q_ASSERT(pos >= 0);
    Q_ASSERT(blocks.length() == fragments.length());
    Q_ASSERT(blocks.length() > pos);

    int b = blocks.findNode(pos);
    uint x = fragments.findNode(pos);

    Q_ASSERT(x && (int)fragments.position(x) == pos);
    Q_ASSERT(fragments.size(x) == 1);
    Q_ASSERT(isValidBlockSeparator(text.at(fragments.fragment(x)->stringPosition)));
    Q_ASSERT(b);

    if (blocks.size(b) == 1 && command == QTextUndoCommand::BlockAdded) {
        Q_ASSERT((int)blocks.position(b) == pos);
        // qDebug("removing empty block");
        // empty block remove the block itself
    } else {
        // non empty block, merge with next one into this block
        // qDebug("merging block with next");
        int n = blocks.next(b);
        Q_ASSERT((int)blocks.position(n) == pos + 1);
        blocks.setSize(b, blocks.size(b) + blocks.size(n) - 1);
        blocks.fragment(b)->userState = blocks.fragment(n)->userState;
        b = n;
    }
    *blockFormat = blocks.fragment(b)->format;

    QTextBlockGroup *group = qobject_cast<QTextBlockGroup *>(objectForFormat(blocks.fragment(b)->format));
    if (group)
        group->blockRemoved(QTextBlock(this, b));

    QTextFrame *frame = qobject_cast<QTextFrame *>(objectForFormat(fragments.fragment(x)->format));
    if (frame) {
        frame->d_func()->fragmentRemoved(text.at(fragments.fragment(x)->stringPosition), x);
        framesDirty = true;
    }

    blocks.erase_single(b);
    const int w = fragments.erase_single(x);

    adjustDocumentChangesAndCursors(pos, -1, op);

    return w;
}